

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall xLearn::Solver::print_logo(Solver *this)

{
  ostream *poVar1;
  Modifier reset;
  Modifier bold;
  Modifier def;
  Modifier green;
  string logo;
  Modifier local_38;
  Modifier local_34;
  Modifier local_30;
  Modifier local_2c;
  string local_28 [32];
  
  std::__cxx11::string::string
            (local_28,
             "----------------------------------------------------------------------------------------------\n           _\n          | |\n     __  _| |     ___  __ _ _ __ _ __\n     \\ \\/ / |    / _ \\/ _` | \'__| \'_ \\ \n      >  <| |___|  __/ (_| | |  | | | |\n     /_/\\_\\_____/\\___|\\__,_|_|  |_| |_|\n\n        xLearn   -- 0.44 Version --\n----------------------------------------------------------------------------------------------\n\n"
             ,(allocator *)&local_2c);
  local_38.code = RESET;
  local_2c.code = FG_GREEN;
  local_30.code = FG_DEFAULT;
  local_34.code = BOLD;
  poVar1 = Color::operator<<((ostream *)&std::cout,&local_2c);
  poVar1 = Color::operator<<(poVar1,&local_34);
  poVar1 = std::operator<<(poVar1,local_28);
  poVar1 = Color::operator<<(poVar1,&local_30);
  Color::operator<<(poVar1,&local_38);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void Solver::print_logo() const {
  std::string logo = 
"----------------------------------------------------------------------------------------------\n"
                    "           _\n"
                    "          | |\n"
                    "     __  _| |     ___  __ _ _ __ _ __\n"
                    "     \\ \\/ / |    / _ \\/ _` | '__| '_ \\ \n"
                    "      >  <| |___|  __/ (_| | |  | | | |\n"
                    "     /_/\\_\\_____/\\___|\\__,_|_|  |_| |_|\n\n"
                    "        xLearn   -- 0.44 Version --\n"
"----------------------------------------------------------------------------------------------\n"
"\n";
  Color::Modifier green(Color::FG_GREEN);
  Color::Modifier def(Color::FG_DEFAULT);
  Color::Modifier bold(Color::BOLD);
  Color::Modifier reset(Color::RESET);
  std::cout << green << bold << logo << def << reset;
}